

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::SetWvel_loc(ChFrameMoving<double> *this,ChVector<double> *wl)

{
  ChQuaternion<double> *this_00;
  ChQuaternion<double> local_28;
  
  local_28.m_data[0] = 0.0;
  this_00 = &(this->coord_dt).rot;
  local_28.m_data[1] = wl->m_data[0];
  local_28.m_data[2] = wl->m_data[1];
  local_28.m_data[3] = wl->m_data[2];
  ChQuaternion<double>::Cross(this_00,&(this->super_ChFrame<double>).coord.rot,&local_28);
  ChQuaternion<double>::operator*=(this_00,0.5);
  return;
}

Assistant:

virtual void SetWvel_loc(const ChVector<Real>& wl) {
        coord_dt.rot.Cross(this->coord.rot, ChQuaternion<Real>(0, wl));
        coord_dt.rot *= (Real)0.5;  // q_dt = 1/2 * q * (0,wl)
    }